

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

LazyBailOutRecord * __thiscall
Memory::AllocateArray<Memory::ArenaAllocator,LazyBailOutRecord,false>
          (Memory *this,ArenaAllocator *allocator,offset_in_ArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  LazyBailOutRecord *pLVar1;
  LazyBailOutRecord *pLVar2;
  
  if (count == 0) {
    pLVar1 = (LazyBailOutRecord *)0x8;
  }
  else {
    pLVar1 = (LazyBailOutRecord *)
             new__<Memory::ArenaAllocator>
                       (-(ulong)(count >> 0x3c != 0) | count * 0x10,(ArenaAllocator *)this,
                        (offset_in_ArenaAllocator_to_subr)allocator);
    pLVar2 = pLVar1;
    do {
      pLVar2->offset = 0;
      pLVar2->bailOutRecord = (BailOutRecord *)0x0;
      pLVar2 = pLVar2 + 1;
    } while (pLVar2 != pLVar1 + count);
  }
  return pLVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}